

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspline_patch.h
# Opt level: O1

void __thiscall
embree::BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
          (BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *this,vboolf_impl<4> *valid,
          vfloat_impl<4> *uu,vfloat_impl<4> *vv,float *P,float *dPdu,float *dPdv,float *ddPdudu,
          float *ddPdvdv,float *ddPdudv,float dscale,size_t dstride,size_t N)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  
  if ((P != (float *)0x0) && (N != 0)) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar22 = 1.0 - fVar42;
    fVar24 = 1.0 - fVar44;
    fVar26 = 1.0 - fVar46;
    fVar28 = 1.0 - fVar48;
    fVar30 = fVar22 * fVar22 * fVar22;
    fVar31 = fVar24 * fVar24 * fVar24;
    fVar32 = fVar26 * fVar26 * fVar26;
    fVar33 = fVar28 * fVar28 * fVar28;
    fVar34 = fVar42 * fVar42 * fVar42;
    fVar35 = fVar44 * fVar44 * fVar44;
    fVar36 = fVar46 * fVar46 * fVar46;
    fVar37 = fVar48 * fVar48 * fVar48;
    fVar23 = fVar22 * fVar42 * fVar22;
    fVar25 = fVar24 * fVar44 * fVar24;
    fVar27 = fVar26 * fVar46 * fVar26;
    fVar29 = fVar28 * fVar48 * fVar28;
    fVar42 = fVar42 * fVar22 * fVar42;
    fVar44 = fVar44 * fVar24 * fVar44;
    fVar46 = fVar46 * fVar26 * fVar46;
    fVar48 = fVar48 * fVar28 * fVar48;
    fVar22 = (vv->field_0).v[0];
    fVar24 = (vv->field_0).v[1];
    fVar26 = (vv->field_0).v[2];
    fVar28 = (vv->field_0).v[3];
    fVar14 = 1.0 - fVar22;
    fVar16 = 1.0 - fVar24;
    fVar18 = 1.0 - fVar26;
    fVar20 = 1.0 - fVar28;
    fVar38 = fVar14 * fVar14 * fVar14;
    fVar39 = fVar16 * fVar16 * fVar16;
    fVar40 = fVar18 * fVar18 * fVar18;
    fVar41 = fVar20 * fVar20 * fVar20;
    fVar43 = fVar22 * fVar22 * fVar22;
    fVar45 = fVar24 * fVar24 * fVar24;
    fVar47 = fVar26 * fVar26 * fVar26;
    fVar49 = fVar28 * fVar28 * fVar28;
    fVar15 = fVar14 * fVar22 * fVar14;
    fVar17 = fVar16 * fVar24 * fVar16;
    fVar19 = fVar18 * fVar26 * fVar18;
    fVar21 = fVar20 * fVar28 * fVar20;
    fVar22 = fVar22 * fVar14 * fVar22;
    fVar24 = fVar24 * fVar16 * fVar24;
    fVar26 = fVar26 * fVar18 * fVar26;
    fVar28 = fVar28 * fVar20 * fVar28;
    fVar14 = fVar38 * 0.16666667;
    fVar16 = fVar39 * 0.16666667;
    fVar18 = fVar40 * 0.16666667;
    fVar20 = fVar41 * 0.16666667;
    fVar50 = (fVar22 * 6.0 + fVar15 * 12.0 + fVar38 * 4.0 + fVar43) * 0.16666667;
    fVar51 = (fVar24 * 6.0 + fVar17 * 12.0 + fVar39 * 4.0 + fVar45) * 0.16666667;
    fVar52 = (fVar26 * 6.0 + fVar19 * 12.0 + fVar40 * 4.0 + fVar47) * 0.16666667;
    fVar53 = (fVar28 * 6.0 + fVar21 * 12.0 + fVar41 * 4.0 + fVar49) * 0.16666667;
    fVar22 = (fVar15 * 6.0 + fVar22 * 12.0 + fVar43 * 4.0 + fVar38) * 0.16666667;
    fVar24 = (fVar17 * 6.0 + fVar24 * 12.0 + fVar45 * 4.0 + fVar39) * 0.16666667;
    fVar26 = (fVar19 * 6.0 + fVar26 * 12.0 + fVar47 * 4.0 + fVar40) * 0.16666667;
    fVar28 = (fVar21 * 6.0 + fVar28 * 12.0 + fVar49 * 4.0 + fVar41) * 0.16666667;
    fVar43 = fVar43 * 0.16666667;
    fVar45 = fVar45 * 0.16666667;
    fVar47 = fVar47 * 0.16666667;
    fVar49 = fVar49 * 0.16666667;
    sVar13 = 0;
    do {
      fVar15 = *(float *)(this + sVar13 * 4);
      fVar17 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar19 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar21 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar38 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar39 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar40 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar41 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar1 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar2 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar3 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar4 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar5 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar6 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar7 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar8 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *P = (float)(~(valid->field_0).i[0] & (uint)*P |
                  (uint)((fVar21 * fVar14 + fVar6 * fVar50 + fVar7 * fVar22 + fVar8 * fVar43) *
                         fVar34 * 0.16666667 +
                         (fVar19 * fVar14 + fVar5 * fVar50 + fVar3 * fVar22 + fVar4 * fVar43) *
                         (fVar23 * 6.0 + fVar42 * 12.0 + fVar34 * 4.0 + fVar30) * 0.16666667 +
                         (fVar17 * fVar14 + fVar41 * fVar50 + fVar1 * fVar22 + fVar2 * fVar43) *
                         (fVar42 * 6.0 + fVar23 * 12.0 + fVar30 * 4.0 + fVar34) * 0.16666667 +
                        (fVar15 * fVar14 + fVar38 * fVar50 + fVar39 * fVar22 + fVar40 * fVar43) *
                        fVar30 * 0.16666667) & (valid->field_0).i[0]);
      P[1] = (float)(~uVar10 & (uint)P[1] |
                    (uint)((fVar21 * fVar16 + fVar6 * fVar51 + fVar7 * fVar24 + fVar8 * fVar45) *
                           fVar35 * 0.16666667 +
                           (fVar19 * fVar16 + fVar5 * fVar51 + fVar3 * fVar24 + fVar4 * fVar45) *
                           (fVar25 * 6.0 + fVar44 * 12.0 + fVar35 * 4.0 + fVar31) * 0.16666667 +
                           (fVar17 * fVar16 + fVar41 * fVar51 + fVar1 * fVar24 + fVar2 * fVar45) *
                           (fVar44 * 6.0 + fVar25 * 12.0 + fVar31 * 4.0 + fVar35) * 0.16666667 +
                          (fVar15 * fVar16 + fVar38 * fVar51 + fVar39 * fVar24 + fVar40 * fVar45) *
                          fVar31 * 0.16666667) & uVar10);
      P[2] = (float)(~uVar11 & (uint)P[2] |
                    (uint)((fVar21 * fVar18 + fVar6 * fVar52 + fVar7 * fVar26 + fVar8 * fVar47) *
                           fVar36 * 0.16666667 +
                           (fVar19 * fVar18 + fVar5 * fVar52 + fVar3 * fVar26 + fVar4 * fVar47) *
                           (fVar27 * 6.0 + fVar46 * 12.0 + fVar36 * 4.0 + fVar32) * 0.16666667 +
                           (fVar17 * fVar18 + fVar41 * fVar52 + fVar1 * fVar26 + fVar2 * fVar47) *
                           (fVar46 * 6.0 + fVar27 * 12.0 + fVar32 * 4.0 + fVar36) * 0.16666667 +
                          (fVar15 * fVar18 + fVar38 * fVar52 + fVar39 * fVar26 + fVar40 * fVar47) *
                          fVar32 * 0.16666667) & uVar11);
      P[3] = (float)(~uVar12 & (uint)P[3] |
                    (uint)((fVar21 * fVar20 + fVar6 * fVar53 + fVar7 * fVar28 + fVar8 * fVar49) *
                           fVar37 * 0.16666667 +
                           (fVar19 * fVar20 + fVar5 * fVar53 + fVar3 * fVar28 + fVar4 * fVar49) *
                           (fVar29 * 6.0 + fVar48 * 12.0 + fVar37 * 4.0 + fVar33) * 0.16666667 +
                           (fVar17 * fVar20 + fVar41 * fVar53 + fVar1 * fVar28 + fVar2 * fVar49) *
                           (fVar48 * 6.0 + fVar29 * 12.0 + fVar33 * 4.0 + fVar37) * 0.16666667 +
                          (fVar15 * fVar20 + fVar38 * fVar53 + fVar39 * fVar28 + fVar40 * fVar49) *
                          fVar33 * 0.16666667) & uVar12);
      sVar13 = sVar13 + 1;
      P = P + dstride;
    } while (N != sVar13);
  }
  if (dPdu != (float *)0x0) {
    if (N != 0) {
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar18 = 1.0 - fVar42;
      fVar19 = 1.0 - fVar44;
      fVar20 = 1.0 - fVar46;
      fVar21 = 1.0 - fVar48;
      fVar14 = fVar42 * fVar18 * 4.0;
      fVar15 = fVar44 * fVar19 * 4.0;
      fVar16 = fVar46 * fVar20 * 4.0;
      fVar17 = fVar48 * fVar21 * 4.0;
      fVar22 = (vv->field_0).v[0];
      fVar24 = (vv->field_0).v[1];
      fVar26 = (vv->field_0).v[2];
      fVar28 = (vv->field_0).v[3];
      fVar23 = 1.0 - fVar22;
      fVar27 = 1.0 - fVar24;
      fVar30 = 1.0 - fVar26;
      fVar32 = 1.0 - fVar28;
      fVar34 = fVar23 * fVar23 * fVar23;
      fVar35 = fVar27 * fVar27 * fVar27;
      fVar36 = fVar30 * fVar30 * fVar30;
      fVar37 = fVar32 * fVar32 * fVar32;
      fVar38 = fVar22 * fVar22 * fVar22;
      fVar39 = fVar24 * fVar24 * fVar24;
      fVar40 = fVar26 * fVar26 * fVar26;
      fVar41 = fVar28 * fVar28 * fVar28;
      fVar25 = fVar23 * fVar22 * fVar23;
      fVar29 = fVar27 * fVar24 * fVar27;
      fVar31 = fVar30 * fVar26 * fVar30;
      fVar33 = fVar32 * fVar28 * fVar32;
      fVar22 = fVar22 * fVar23 * fVar22;
      fVar24 = fVar24 * fVar27 * fVar24;
      fVar26 = fVar26 * fVar30 * fVar26;
      fVar28 = fVar28 * fVar32 * fVar28;
      fVar23 = fVar34 * 0.16666667;
      fVar27 = fVar35 * 0.16666667;
      fVar30 = fVar36 * 0.16666667;
      fVar32 = fVar37 * 0.16666667;
      fVar43 = (fVar22 * 6.0 + fVar25 * 12.0 + fVar34 * 4.0 + fVar38) * 0.16666667;
      fVar45 = (fVar24 * 6.0 + fVar29 * 12.0 + fVar35 * 4.0 + fVar39) * 0.16666667;
      fVar47 = (fVar26 * 6.0 + fVar31 * 12.0 + fVar36 * 4.0 + fVar40) * 0.16666667;
      fVar49 = (fVar28 * 6.0 + fVar33 * 12.0 + fVar37 * 4.0 + fVar41) * 0.16666667;
      fVar22 = (fVar25 * 6.0 + fVar22 * 12.0 + fVar38 * 4.0 + fVar34) * 0.16666667;
      fVar24 = (fVar29 * 6.0 + fVar24 * 12.0 + fVar39 * 4.0 + fVar35) * 0.16666667;
      fVar26 = (fVar31 * 6.0 + fVar26 * 12.0 + fVar40 * 4.0 + fVar36) * 0.16666667;
      fVar28 = (fVar33 * 6.0 + fVar28 * 12.0 + fVar41 * 4.0 + fVar37) * 0.16666667;
      fVar38 = fVar38 * 0.16666667;
      fVar39 = fVar39 * 0.16666667;
      fVar40 = fVar40 * 0.16666667;
      fVar41 = fVar41 * 0.16666667;
      sVar13 = 0;
      do {
        fVar25 = *(float *)(this + sVar13 * 4);
        fVar29 = *(float *)(this + sVar13 * 4 + 0x10);
        fVar31 = *(float *)(this + sVar13 * 4 + 0x20);
        fVar33 = *(float *)(this + sVar13 * 4 + 0x30);
        fVar34 = *(float *)(this + sVar13 * 4 + 0x40);
        fVar35 = *(float *)(this + sVar13 * 4 + 0x80);
        fVar36 = *(float *)(this + sVar13 * 4 + 0xc0);
        fVar37 = *(float *)(this + sVar13 * 4 + 0x50);
        fVar50 = *(float *)(this + sVar13 * 4 + 0x90);
        fVar51 = *(float *)(this + sVar13 * 4 + 0xd0);
        fVar52 = *(float *)(this + sVar13 * 4 + 0xa0);
        fVar53 = *(float *)(this + sVar13 * 4 + 0xe0);
        fVar1 = *(float *)(this + sVar13 * 4 + 0x60);
        fVar2 = *(float *)(this + sVar13 * 4 + 0x70);
        fVar3 = *(float *)(this + sVar13 * 4 + 0xb0);
        fVar4 = *(float *)(this + sVar13 * 4 + 0xf0);
        uVar10 = (valid->field_0).i[1];
        uVar11 = (valid->field_0).i[2];
        uVar12 = (valid->field_0).i[3];
        *dPdu = (float)(~(valid->field_0).i[0] & (uint)*dPdu |
                       (uint)(((fVar33 * fVar23 + fVar2 * fVar43 + fVar3 * fVar22 + fVar4 * fVar38)
                               * fVar42 * fVar42 * 0.5 +
                               (fVar31 * fVar23 + fVar1 * fVar43 + fVar52 * fVar22 + fVar53 * fVar38
                               ) * (fVar18 * fVar18 + fVar14) * 0.5 +
                               (fVar29 * fVar23 +
                               fVar37 * fVar43 + fVar50 * fVar22 + fVar51 * fVar38) *
                               (-fVar42 * fVar42 - fVar14) * 0.5 +
                              (fVar25 * fVar23 + fVar34 * fVar43 + fVar35 * fVar22 + fVar36 * fVar38
                              ) * -fVar18 * fVar18 * 0.5) * dscale) & (valid->field_0).i[0]);
        dPdu[1] = (float)(~uVar10 & (uint)dPdu[1] |
                         (uint)(((fVar33 * fVar27 + fVar2 * fVar45 + fVar3 * fVar24 + fVar4 * fVar39
                                 ) * fVar44 * fVar44 * 0.5 +
                                 (fVar31 * fVar27 +
                                 fVar1 * fVar45 + fVar52 * fVar24 + fVar53 * fVar39) *
                                 (fVar19 * fVar19 + fVar15) * 0.5 +
                                 (fVar29 * fVar27 +
                                 fVar37 * fVar45 + fVar50 * fVar24 + fVar51 * fVar39) *
                                 (-fVar44 * fVar44 - fVar15) * 0.5 +
                                (fVar25 * fVar27 +
                                fVar34 * fVar45 + fVar35 * fVar24 + fVar36 * fVar39) *
                                -fVar19 * fVar19 * 0.5) * dscale) & uVar10);
        dPdu[2] = (float)(~uVar11 & (uint)dPdu[2] |
                         (uint)(((fVar33 * fVar30 + fVar2 * fVar47 + fVar3 * fVar26 + fVar4 * fVar40
                                 ) * fVar46 * fVar46 * 0.5 +
                                 (fVar31 * fVar30 +
                                 fVar1 * fVar47 + fVar52 * fVar26 + fVar53 * fVar40) *
                                 (fVar20 * fVar20 + fVar16) * 0.5 +
                                 (fVar29 * fVar30 +
                                 fVar37 * fVar47 + fVar50 * fVar26 + fVar51 * fVar40) *
                                 (-fVar46 * fVar46 - fVar16) * 0.5 +
                                (fVar25 * fVar30 +
                                fVar34 * fVar47 + fVar35 * fVar26 + fVar36 * fVar40) *
                                -fVar20 * fVar20 * 0.5) * dscale) & uVar11);
        dPdu[3] = (float)(~uVar12 & (uint)dPdu[3] |
                         (uint)(((fVar33 * fVar32 + fVar2 * fVar49 + fVar3 * fVar28 + fVar4 * fVar41
                                 ) * fVar48 * fVar48 * 0.5 +
                                 (fVar31 * fVar32 +
                                 fVar1 * fVar49 + fVar52 * fVar28 + fVar53 * fVar41) *
                                 (fVar21 * fVar21 + fVar17) * 0.5 +
                                 (fVar29 * fVar32 +
                                 fVar37 * fVar49 + fVar50 * fVar28 + fVar51 * fVar41) *
                                 (-fVar48 * fVar48 - fVar17) * 0.5 +
                                (fVar25 * fVar32 +
                                fVar34 * fVar49 + fVar35 * fVar28 + fVar36 * fVar41) *
                                -fVar21 * fVar21 * 0.5) * dscale) & uVar12);
        sVar13 = sVar13 + 1;
        dPdu = dPdu + dstride;
      } while (N != sVar13);
    }
    if (N != 0) {
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar22 = 1.0 - fVar42;
      fVar24 = 1.0 - fVar44;
      fVar26 = 1.0 - fVar46;
      fVar28 = 1.0 - fVar48;
      fVar34 = fVar22 * fVar22 * fVar22;
      fVar35 = fVar24 * fVar24 * fVar24;
      fVar36 = fVar26 * fVar26 * fVar26;
      fVar37 = fVar28 * fVar28 * fVar28;
      fVar38 = fVar42 * fVar42 * fVar42;
      fVar39 = fVar44 * fVar44 * fVar44;
      fVar40 = fVar46 * fVar46 * fVar46;
      fVar41 = fVar48 * fVar48 * fVar48;
      fVar30 = fVar22 * fVar42 * fVar22;
      fVar31 = fVar24 * fVar44 * fVar24;
      fVar32 = fVar26 * fVar46 * fVar26;
      fVar33 = fVar28 * fVar48 * fVar28;
      fVar42 = fVar42 * fVar22 * fVar42;
      fVar44 = fVar44 * fVar24 * fVar44;
      fVar46 = fVar46 * fVar26 * fVar46;
      fVar48 = fVar48 * fVar28 * fVar48;
      fVar22 = (vv->field_0).v[0];
      fVar24 = (vv->field_0).v[1];
      fVar26 = (vv->field_0).v[2];
      fVar28 = (vv->field_0).v[3];
      fVar18 = 1.0 - fVar22;
      fVar19 = 1.0 - fVar24;
      fVar20 = 1.0 - fVar26;
      fVar21 = 1.0 - fVar28;
      fVar14 = fVar22 * fVar18 * 4.0;
      fVar15 = fVar24 * fVar19 * 4.0;
      fVar16 = fVar26 * fVar20 * 4.0;
      fVar17 = fVar28 * fVar21 * 4.0;
      fVar23 = -fVar18 * fVar18 * 0.5;
      fVar25 = -fVar19 * fVar19 * 0.5;
      fVar27 = -fVar20 * fVar20 * 0.5;
      fVar29 = -fVar21 * fVar21 * 0.5;
      fVar43 = (-fVar22 * fVar22 - fVar14) * 0.5;
      fVar45 = (-fVar24 * fVar24 - fVar15) * 0.5;
      fVar47 = (-fVar26 * fVar26 - fVar16) * 0.5;
      fVar49 = (-fVar28 * fVar28 - fVar17) * 0.5;
      fVar14 = (fVar18 * fVar18 + fVar14) * 0.5;
      fVar15 = (fVar19 * fVar19 + fVar15) * 0.5;
      fVar16 = (fVar20 * fVar20 + fVar16) * 0.5;
      fVar17 = (fVar21 * fVar21 + fVar17) * 0.5;
      fVar22 = fVar22 * fVar22 * 0.5;
      fVar24 = fVar24 * fVar24 * 0.5;
      fVar26 = fVar26 * fVar26 * 0.5;
      fVar28 = fVar28 * fVar28 * 0.5;
      sVar13 = 0;
      do {
        fVar18 = *(float *)(this + sVar13 * 4);
        fVar19 = *(float *)(this + sVar13 * 4 + 0x10);
        fVar20 = *(float *)(this + sVar13 * 4 + 0x20);
        fVar21 = *(float *)(this + sVar13 * 4 + 0x30);
        fVar50 = *(float *)(this + sVar13 * 4 + 0x40);
        fVar51 = *(float *)(this + sVar13 * 4 + 0x80);
        fVar52 = *(float *)(this + sVar13 * 4 + 0xc0);
        fVar53 = *(float *)(this + sVar13 * 4 + 0x50);
        fVar1 = *(float *)(this + sVar13 * 4 + 0x90);
        fVar2 = *(float *)(this + sVar13 * 4 + 0xd0);
        fVar3 = *(float *)(this + sVar13 * 4 + 0xa0);
        fVar4 = *(float *)(this + sVar13 * 4 + 0xe0);
        fVar5 = *(float *)(this + sVar13 * 4 + 0x60);
        fVar6 = *(float *)(this + sVar13 * 4 + 0x70);
        fVar7 = *(float *)(this + sVar13 * 4 + 0xb0);
        fVar8 = *(float *)(this + sVar13 * 4 + 0xf0);
        uVar10 = (valid->field_0).i[1];
        uVar11 = (valid->field_0).i[2];
        uVar12 = (valid->field_0).i[3];
        *dPdv = (float)(~(valid->field_0).i[0] & (uint)*dPdv |
                       (uint)(((fVar21 * fVar23 + fVar6 * fVar43 + fVar7 * fVar14 + fVar8 * fVar22)
                               * fVar38 * 0.16666667 +
                               (fVar20 * fVar23 + fVar5 * fVar43 + fVar3 * fVar14 + fVar4 * fVar22)
                               * (fVar30 * 6.0 + fVar42 * 12.0 + fVar38 * 4.0 + fVar34) * 0.16666667
                               + (fVar19 * fVar23 +
                                 fVar53 * fVar43 + fVar1 * fVar14 + fVar2 * fVar22) *
                                 (fVar42 * 6.0 + fVar30 * 12.0 + fVar34 * 4.0 + fVar38) * 0.16666667
                              + (fVar18 * fVar23 +
                                fVar50 * fVar43 + fVar51 * fVar14 + fVar52 * fVar22) *
                                fVar34 * 0.16666667) * dscale) & (valid->field_0).i[0]);
        dPdv[1] = (float)(~uVar10 & (uint)dPdv[1] |
                         (uint)(((fVar21 * fVar25 + fVar6 * fVar45 + fVar7 * fVar15 + fVar8 * fVar24
                                 ) * fVar39 * 0.16666667 +
                                 (fVar20 * fVar25 + fVar5 * fVar45 + fVar3 * fVar15 + fVar4 * fVar24
                                 ) * (fVar31 * 6.0 + fVar44 * 12.0 + fVar39 * 4.0 + fVar35) *
                                     0.16666667 +
                                 (fVar19 * fVar25 +
                                 fVar53 * fVar45 + fVar1 * fVar15 + fVar2 * fVar24) *
                                 (fVar44 * 6.0 + fVar31 * 12.0 + fVar35 * 4.0 + fVar39) * 0.16666667
                                + (fVar18 * fVar25 +
                                  fVar50 * fVar45 + fVar51 * fVar15 + fVar52 * fVar24) *
                                  fVar35 * 0.16666667) * dscale) & uVar10);
        dPdv[2] = (float)(~uVar11 & (uint)dPdv[2] |
                         (uint)(((fVar21 * fVar27 + fVar6 * fVar47 + fVar7 * fVar16 + fVar8 * fVar26
                                 ) * fVar40 * 0.16666667 +
                                 (fVar20 * fVar27 + fVar5 * fVar47 + fVar3 * fVar16 + fVar4 * fVar26
                                 ) * (fVar32 * 6.0 + fVar46 * 12.0 + fVar40 * 4.0 + fVar36) *
                                     0.16666667 +
                                 (fVar19 * fVar27 +
                                 fVar53 * fVar47 + fVar1 * fVar16 + fVar2 * fVar26) *
                                 (fVar46 * 6.0 + fVar32 * 12.0 + fVar36 * 4.0 + fVar40) * 0.16666667
                                + (fVar18 * fVar27 +
                                  fVar50 * fVar47 + fVar51 * fVar16 + fVar52 * fVar26) *
                                  fVar36 * 0.16666667) * dscale) & uVar11);
        dPdv[3] = (float)(~uVar12 & (uint)dPdv[3] |
                         (uint)(((fVar21 * fVar29 + fVar6 * fVar49 + fVar7 * fVar17 + fVar8 * fVar28
                                 ) * fVar41 * 0.16666667 +
                                 (fVar20 * fVar29 + fVar5 * fVar49 + fVar3 * fVar17 + fVar4 * fVar28
                                 ) * (fVar33 * 6.0 + fVar48 * 12.0 + fVar41 * 4.0 + fVar37) *
                                     0.16666667 +
                                 (fVar19 * fVar29 +
                                 fVar53 * fVar49 + fVar1 * fVar17 + fVar2 * fVar28) *
                                 (fVar48 * 6.0 + fVar33 * 12.0 + fVar37 * 4.0 + fVar41) * 0.16666667
                                + (fVar18 * fVar29 +
                                  fVar50 * fVar49 + fVar51 * fVar17 + fVar52 * fVar28) *
                                  fVar37 * 0.16666667) * dscale) & uVar12);
        sVar13 = sVar13 + 1;
        dPdv = dPdv + dstride;
      } while (N != sVar13);
    }
  }
  if (ddPdudu != (float *)0x0) {
    if (N != 0) {
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar14 = 1.0 - fVar42;
      fVar15 = 1.0 - fVar44;
      fVar16 = 1.0 - fVar46;
      fVar17 = 1.0 - fVar48;
      fVar22 = (vv->field_0).v[0];
      fVar24 = (vv->field_0).v[1];
      fVar26 = (vv->field_0).v[2];
      fVar28 = (vv->field_0).v[3];
      fVar18 = 1.0 - fVar22;
      fVar20 = 1.0 - fVar24;
      fVar23 = 1.0 - fVar26;
      fVar27 = 1.0 - fVar28;
      fVar30 = fVar18 * fVar18 * fVar18;
      fVar31 = fVar20 * fVar20 * fVar20;
      fVar32 = fVar23 * fVar23 * fVar23;
      fVar33 = fVar27 * fVar27 * fVar27;
      fVar35 = fVar22 * fVar22 * fVar22;
      fVar36 = fVar24 * fVar24 * fVar24;
      fVar37 = fVar26 * fVar26 * fVar26;
      fVar38 = fVar28 * fVar28 * fVar28;
      fVar19 = fVar18 * fVar22 * fVar18;
      fVar21 = fVar20 * fVar24 * fVar20;
      fVar25 = fVar23 * fVar26 * fVar23;
      fVar29 = fVar27 * fVar28 * fVar27;
      fVar22 = fVar22 * fVar18 * fVar22;
      fVar24 = fVar24 * fVar20 * fVar24;
      fVar26 = fVar26 * fVar23 * fVar26;
      fVar28 = fVar28 * fVar27 * fVar28;
      fVar20 = fVar30 * 0.16666667;
      fVar23 = fVar31 * 0.16666667;
      fVar27 = fVar32 * 0.16666667;
      fVar34 = fVar33 * 0.16666667;
      fVar39 = (fVar22 * 6.0 + fVar19 * 12.0 + fVar30 * 4.0 + fVar35) * 0.16666667;
      fVar40 = (fVar24 * 6.0 + fVar21 * 12.0 + fVar31 * 4.0 + fVar36) * 0.16666667;
      fVar41 = (fVar26 * 6.0 + fVar25 * 12.0 + fVar32 * 4.0 + fVar37) * 0.16666667;
      fVar43 = (fVar28 * 6.0 + fVar29 * 12.0 + fVar33 * 4.0 + fVar38) * 0.16666667;
      fVar18 = (fVar19 * 6.0 + fVar22 * 12.0 + fVar35 * 4.0 + fVar30) * 0.16666667;
      fVar24 = (fVar21 * 6.0 + fVar24 * 12.0 + fVar36 * 4.0 + fVar31) * 0.16666667;
      fVar26 = (fVar25 * 6.0 + fVar26 * 12.0 + fVar37 * 4.0 + fVar32) * 0.16666667;
      fVar28 = (fVar29 * 6.0 + fVar28 * 12.0 + fVar38 * 4.0 + fVar33) * 0.16666667;
      fVar35 = fVar35 * 0.16666667;
      fVar36 = fVar36 * 0.16666667;
      fVar37 = fVar37 * 0.16666667;
      fVar38 = fVar38 * 0.16666667;
      fVar22 = dscale * dscale;
      sVar13 = 0;
      do {
        fVar19 = *(float *)(this + sVar13 * 4);
        fVar21 = *(float *)(this + sVar13 * 4 + 0x10);
        fVar25 = *(float *)(this + sVar13 * 4 + 0x20);
        fVar29 = *(float *)(this + sVar13 * 4 + 0x30);
        fVar30 = *(float *)(this + sVar13 * 4 + 0x40);
        fVar31 = *(float *)(this + sVar13 * 4 + 0x80);
        fVar32 = *(float *)(this + sVar13 * 4 + 0xc0);
        fVar33 = *(float *)(this + sVar13 * 4 + 0x50);
        fVar45 = *(float *)(this + sVar13 * 4 + 0x90);
        fVar47 = *(float *)(this + sVar13 * 4 + 0xd0);
        fVar49 = *(float *)(this + sVar13 * 4 + 0xa0);
        fVar50 = *(float *)(this + sVar13 * 4 + 0xe0);
        fVar51 = *(float *)(this + sVar13 * 4 + 0x60);
        fVar52 = *(float *)(this + sVar13 * 4 + 0x70);
        fVar53 = *(float *)(this + sVar13 * 4 + 0xb0);
        fVar1 = *(float *)(this + sVar13 * 4 + 0xf0);
        uVar10 = (valid->field_0).i[1];
        uVar11 = (valid->field_0).i[2];
        uVar12 = (valid->field_0).i[3];
        *ddPdudu = (float)(~(valid->field_0).i[0] & (uint)*ddPdudu |
                          (uint)(((fVar19 * fVar20 +
                                  fVar30 * fVar39 + fVar31 * fVar18 + fVar32 * fVar35) * fVar14 +
                                 (fVar29 * fVar20 +
                                 fVar52 * fVar39 + fVar53 * fVar18 + fVar1 * fVar35) * fVar42 +
                                 (fVar25 * fVar20 +
                                 fVar51 * fVar39 + fVar49 * fVar18 + fVar50 * fVar35) *
                                 (fVar14 - (fVar42 + fVar42)) +
                                 (fVar21 * fVar20 +
                                 fVar33 * fVar39 + fVar45 * fVar18 + fVar47 * fVar35) *
                                 (fVar42 - (fVar14 + fVar14))) * fVar22) & (valid->field_0).i[0]);
        ddPdudu[1] = (float)(~uVar10 & (uint)ddPdudu[1] |
                            (uint)(((fVar19 * fVar23 +
                                    fVar30 * fVar40 + fVar31 * fVar24 + fVar32 * fVar36) * fVar15 +
                                   (fVar29 * fVar23 +
                                   fVar52 * fVar40 + fVar53 * fVar24 + fVar1 * fVar36) * fVar44 +
                                   (fVar25 * fVar23 +
                                   fVar51 * fVar40 + fVar49 * fVar24 + fVar50 * fVar36) *
                                   (fVar15 - (fVar44 + fVar44)) +
                                   (fVar21 * fVar23 +
                                   fVar33 * fVar40 + fVar45 * fVar24 + fVar47 * fVar36) *
                                   (fVar44 - (fVar15 + fVar15))) * fVar22) & uVar10);
        ddPdudu[2] = (float)(~uVar11 & (uint)ddPdudu[2] |
                            (uint)(((fVar19 * fVar27 +
                                    fVar30 * fVar41 + fVar31 * fVar26 + fVar32 * fVar37) * fVar16 +
                                   (fVar29 * fVar27 +
                                   fVar52 * fVar41 + fVar53 * fVar26 + fVar1 * fVar37) * fVar46 +
                                   (fVar25 * fVar27 +
                                   fVar51 * fVar41 + fVar49 * fVar26 + fVar50 * fVar37) *
                                   (fVar16 - (fVar46 + fVar46)) +
                                   (fVar21 * fVar27 +
                                   fVar33 * fVar41 + fVar45 * fVar26 + fVar47 * fVar37) *
                                   (fVar46 - (fVar16 + fVar16))) * fVar22) & uVar11);
        ddPdudu[3] = (float)(~uVar12 & (uint)ddPdudu[3] |
                            (uint)(((fVar19 * fVar34 +
                                    fVar30 * fVar43 + fVar31 * fVar28 + fVar32 * fVar38) * fVar17 +
                                   (fVar29 * fVar34 +
                                   fVar52 * fVar43 + fVar53 * fVar28 + fVar1 * fVar38) * fVar48 +
                                   (fVar25 * fVar34 +
                                   fVar51 * fVar43 + fVar49 * fVar28 + fVar50 * fVar38) *
                                   (fVar17 - (fVar48 + fVar48)) +
                                   (fVar21 * fVar34 +
                                   fVar33 * fVar43 + fVar45 * fVar28 + fVar47 * fVar38) *
                                   (fVar48 - (fVar17 + fVar17))) * fVar22) & uVar12);
        sVar13 = sVar13 + 1;
        ddPdudu = ddPdudu + dstride;
      } while (N != sVar13);
    }
    if (N != 0) {
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar22 = 1.0 - fVar42;
      fVar24 = 1.0 - fVar44;
      fVar26 = 1.0 - fVar46;
      fVar28 = 1.0 - fVar48;
      fVar31 = fVar22 * fVar22 * fVar22;
      fVar32 = fVar24 * fVar24 * fVar24;
      fVar33 = fVar26 * fVar26 * fVar26;
      fVar34 = fVar28 * fVar28 * fVar28;
      fVar35 = fVar42 * fVar42 * fVar42;
      fVar37 = fVar44 * fVar44 * fVar44;
      fVar39 = fVar46 * fVar46 * fVar46;
      fVar41 = fVar48 * fVar48 * fVar48;
      fVar25 = fVar22 * fVar42 * fVar22;
      fVar27 = fVar24 * fVar44 * fVar24;
      fVar29 = fVar26 * fVar46 * fVar26;
      fVar30 = fVar28 * fVar48 * fVar28;
      fVar42 = fVar42 * fVar22 * fVar42;
      fVar44 = fVar44 * fVar24 * fVar44;
      fVar46 = fVar46 * fVar26 * fVar46;
      fVar48 = fVar48 * fVar28 * fVar48;
      fVar22 = (vv->field_0).v[0];
      fVar24 = (vv->field_0).v[1];
      fVar26 = (vv->field_0).v[2];
      fVar28 = (vv->field_0).v[3];
      fVar15 = 1.0 - fVar22;
      fVar16 = 1.0 - fVar24;
      fVar17 = 1.0 - fVar26;
      fVar18 = 1.0 - fVar28;
      fVar19 = fVar22 - (fVar15 + fVar15);
      fVar20 = fVar24 - (fVar16 + fVar16);
      fVar21 = fVar26 - (fVar17 + fVar17);
      fVar23 = fVar28 - (fVar18 + fVar18);
      fVar36 = fVar15 - (fVar22 + fVar22);
      fVar38 = fVar16 - (fVar24 + fVar24);
      fVar40 = fVar17 - (fVar26 + fVar26);
      fVar43 = fVar18 - (fVar28 + fVar28);
      fVar14 = dscale * dscale;
      sVar13 = 0;
      do {
        fVar45 = *(float *)(this + sVar13 * 4);
        fVar47 = *(float *)(this + sVar13 * 4 + 0x10);
        fVar49 = *(float *)(this + sVar13 * 4 + 0x20);
        fVar50 = *(float *)(this + sVar13 * 4 + 0x30);
        fVar51 = *(float *)(this + sVar13 * 4 + 0x40);
        fVar52 = *(float *)(this + sVar13 * 4 + 0x80);
        fVar53 = *(float *)(this + sVar13 * 4 + 0xc0);
        fVar1 = *(float *)(this + sVar13 * 4 + 0x50);
        fVar2 = *(float *)(this + sVar13 * 4 + 0x90);
        fVar3 = *(float *)(this + sVar13 * 4 + 0xd0);
        fVar4 = *(float *)(this + sVar13 * 4 + 0xa0);
        fVar5 = *(float *)(this + sVar13 * 4 + 0xe0);
        fVar6 = *(float *)(this + sVar13 * 4 + 0x60);
        fVar7 = *(float *)(this + sVar13 * 4 + 0x70);
        fVar8 = *(float *)(this + sVar13 * 4 + 0xb0);
        fVar9 = *(float *)(this + sVar13 * 4 + 0xf0);
        uVar10 = (valid->field_0).i[1];
        uVar11 = (valid->field_0).i[2];
        uVar12 = (valid->field_0).i[3];
        *ddPdvdv = (float)(~(valid->field_0).i[0] & (uint)*ddPdvdv |
                          (uint)(((fVar50 * fVar15 +
                                  fVar7 * fVar19 + fVar8 * fVar36 + fVar9 * fVar22) *
                                  fVar35 * 0.16666667 +
                                  (fVar49 * fVar15 +
                                  fVar6 * fVar19 + fVar4 * fVar36 + fVar5 * fVar22) *
                                  (fVar25 * 6.0 + fVar42 * 12.0 + fVar35 * 4.0 + fVar31) *
                                  0.16666667 +
                                  (fVar47 * fVar15 +
                                  fVar1 * fVar19 + fVar2 * fVar36 + fVar3 * fVar22) *
                                  (fVar42 * 6.0 + fVar25 * 12.0 + fVar31 * 4.0 + fVar35) *
                                  0.16666667 +
                                 (fVar45 * fVar15 +
                                 fVar51 * fVar19 + fVar52 * fVar36 + fVar53 * fVar22) *
                                 fVar31 * 0.16666667) * fVar14) & (valid->field_0).i[0]);
        ddPdvdv[1] = (float)(~uVar10 & (uint)ddPdvdv[1] |
                            (uint)(((fVar50 * fVar16 +
                                    fVar7 * fVar20 + fVar8 * fVar38 + fVar9 * fVar24) *
                                    fVar37 * 0.16666667 +
                                    (fVar49 * fVar16 +
                                    fVar6 * fVar20 + fVar4 * fVar38 + fVar5 * fVar24) *
                                    (fVar27 * 6.0 + fVar44 * 12.0 + fVar37 * 4.0 + fVar32) *
                                    0.16666667 +
                                    (fVar47 * fVar16 +
                                    fVar1 * fVar20 + fVar2 * fVar38 + fVar3 * fVar24) *
                                    (fVar44 * 6.0 + fVar27 * 12.0 + fVar32 * 4.0 + fVar37) *
                                    0.16666667 +
                                   (fVar45 * fVar16 +
                                   fVar51 * fVar20 + fVar52 * fVar38 + fVar53 * fVar24) *
                                   fVar32 * 0.16666667) * fVar14) & uVar10);
        ddPdvdv[2] = (float)(~uVar11 & (uint)ddPdvdv[2] |
                            (uint)(((fVar50 * fVar17 +
                                    fVar7 * fVar21 + fVar8 * fVar40 + fVar9 * fVar26) *
                                    fVar39 * 0.16666667 +
                                    (fVar49 * fVar17 +
                                    fVar6 * fVar21 + fVar4 * fVar40 + fVar5 * fVar26) *
                                    (fVar29 * 6.0 + fVar46 * 12.0 + fVar39 * 4.0 + fVar33) *
                                    0.16666667 +
                                    (fVar47 * fVar17 +
                                    fVar1 * fVar21 + fVar2 * fVar40 + fVar3 * fVar26) *
                                    (fVar46 * 6.0 + fVar29 * 12.0 + fVar33 * 4.0 + fVar39) *
                                    0.16666667 +
                                   (fVar45 * fVar17 +
                                   fVar51 * fVar21 + fVar52 * fVar40 + fVar53 * fVar26) *
                                   fVar33 * 0.16666667) * fVar14) & uVar11);
        ddPdvdv[3] = (float)(~uVar12 & (uint)ddPdvdv[3] |
                            (uint)(((fVar50 * fVar18 +
                                    fVar7 * fVar23 + fVar8 * fVar43 + fVar9 * fVar28) *
                                    fVar41 * 0.16666667 +
                                    (fVar49 * fVar18 +
                                    fVar6 * fVar23 + fVar4 * fVar43 + fVar5 * fVar28) *
                                    (fVar30 * 6.0 + fVar48 * 12.0 + fVar41 * 4.0 + fVar34) *
                                    0.16666667 +
                                    (fVar47 * fVar18 +
                                    fVar1 * fVar23 + fVar2 * fVar43 + fVar3 * fVar28) *
                                    (fVar48 * 6.0 + fVar30 * 12.0 + fVar34 * 4.0 + fVar41) *
                                    0.16666667 +
                                   (fVar45 * fVar18 +
                                   fVar51 * fVar23 + fVar52 * fVar43 + fVar53 * fVar28) *
                                   fVar34 * 0.16666667) * fVar14) & uVar12);
        sVar13 = sVar13 + 1;
        ddPdvdv = ddPdvdv + dstride;
      } while (N != sVar13);
    }
    if (N != 0) {
      fVar42 = (uu->field_0).v[0];
      fVar44 = (uu->field_0).v[1];
      fVar46 = (uu->field_0).v[2];
      fVar48 = (uu->field_0).v[3];
      fVar34 = 1.0 - fVar42;
      fVar35 = 1.0 - fVar44;
      fVar36 = 1.0 - fVar46;
      fVar37 = 1.0 - fVar48;
      fVar14 = fVar42 * fVar34 * 4.0;
      fVar15 = fVar44 * fVar35 * 4.0;
      fVar16 = fVar46 * fVar36 * 4.0;
      fVar17 = fVar48 * fVar37 * 4.0;
      fVar22 = (vv->field_0).v[0];
      fVar24 = (vv->field_0).v[1];
      fVar26 = (vv->field_0).v[2];
      fVar28 = (vv->field_0).v[3];
      fVar18 = 1.0 - fVar22;
      fVar19 = 1.0 - fVar24;
      fVar20 = 1.0 - fVar26;
      fVar21 = 1.0 - fVar28;
      fVar23 = fVar22 * fVar18 * 4.0;
      fVar25 = fVar24 * fVar19 * 4.0;
      fVar27 = fVar26 * fVar20 * 4.0;
      fVar29 = fVar28 * fVar21 * 4.0;
      fVar38 = -fVar18 * fVar18 * 0.5;
      fVar39 = -fVar19 * fVar19 * 0.5;
      fVar40 = -fVar20 * fVar20 * 0.5;
      fVar41 = -fVar21 * fVar21 * 0.5;
      fVar30 = (-fVar22 * fVar22 - fVar23) * 0.5;
      fVar31 = (-fVar24 * fVar24 - fVar25) * 0.5;
      fVar32 = (-fVar26 * fVar26 - fVar27) * 0.5;
      fVar33 = (-fVar28 * fVar28 - fVar29) * 0.5;
      fVar18 = (fVar18 * fVar18 + fVar23) * 0.5;
      fVar19 = (fVar19 * fVar19 + fVar25) * 0.5;
      fVar20 = (fVar20 * fVar20 + fVar27) * 0.5;
      fVar21 = (fVar21 * fVar21 + fVar29) * 0.5;
      fVar23 = fVar22 * fVar22 * 0.5;
      fVar24 = fVar24 * fVar24 * 0.5;
      fVar26 = fVar26 * fVar26 * 0.5;
      fVar28 = fVar28 * fVar28 * 0.5;
      fVar22 = dscale * dscale;
      sVar13 = 0;
      do {
        fVar25 = *(float *)(this + sVar13 * 4);
        fVar27 = *(float *)(this + sVar13 * 4 + 0x10);
        fVar29 = *(float *)(this + sVar13 * 4 + 0x20);
        fVar43 = *(float *)(this + sVar13 * 4 + 0x30);
        fVar45 = *(float *)(this + sVar13 * 4 + 0x40);
        fVar47 = *(float *)(this + sVar13 * 4 + 0x80);
        fVar49 = *(float *)(this + sVar13 * 4 + 0xc0);
        fVar50 = *(float *)(this + sVar13 * 4 + 0x50);
        fVar51 = *(float *)(this + sVar13 * 4 + 0x90);
        fVar52 = *(float *)(this + sVar13 * 4 + 0xd0);
        fVar53 = *(float *)(this + sVar13 * 4 + 0xa0);
        fVar1 = *(float *)(this + sVar13 * 4 + 0xe0);
        fVar2 = *(float *)(this + sVar13 * 4 + 0x60);
        fVar3 = *(float *)(this + sVar13 * 4 + 0x70);
        fVar4 = *(float *)(this + sVar13 * 4 + 0xb0);
        fVar5 = *(float *)(this + sVar13 * 4 + 0xf0);
        uVar10 = (valid->field_0).i[1];
        uVar11 = (valid->field_0).i[2];
        uVar12 = (valid->field_0).i[3];
        *ddPdudv = (float)(~(valid->field_0).i[0] & (uint)*ddPdudv |
                          (uint)(((fVar43 * fVar38 +
                                  fVar3 * fVar30 + fVar4 * fVar18 + fVar5 * fVar23) *
                                  fVar42 * fVar42 * 0.5 +
                                  (fVar29 * fVar38 +
                                  fVar2 * fVar30 + fVar53 * fVar18 + fVar1 * fVar23) *
                                  (fVar34 * fVar34 + fVar14) * 0.5 +
                                  (fVar27 * fVar38 +
                                  fVar50 * fVar30 + fVar51 * fVar18 + fVar52 * fVar23) *
                                  (-fVar42 * fVar42 - fVar14) * 0.5 +
                                 (fVar25 * fVar38 +
                                 fVar45 * fVar30 + fVar47 * fVar18 + fVar49 * fVar23) *
                                 -fVar34 * fVar34 * 0.5) * fVar22) & (valid->field_0).i[0]);
        ddPdudv[1] = (float)(~uVar10 & (uint)ddPdudv[1] |
                            (uint)(((fVar43 * fVar39 +
                                    fVar3 * fVar31 + fVar4 * fVar19 + fVar5 * fVar24) *
                                    fVar44 * fVar44 * 0.5 +
                                    (fVar29 * fVar39 +
                                    fVar2 * fVar31 + fVar53 * fVar19 + fVar1 * fVar24) *
                                    (fVar35 * fVar35 + fVar15) * 0.5 +
                                    (fVar27 * fVar39 +
                                    fVar50 * fVar31 + fVar51 * fVar19 + fVar52 * fVar24) *
                                    (-fVar44 * fVar44 - fVar15) * 0.5 +
                                   (fVar25 * fVar39 +
                                   fVar45 * fVar31 + fVar47 * fVar19 + fVar49 * fVar24) *
                                   -fVar35 * fVar35 * 0.5) * fVar22) & uVar10);
        ddPdudv[2] = (float)(~uVar11 & (uint)ddPdudv[2] |
                            (uint)(((fVar43 * fVar40 +
                                    fVar3 * fVar32 + fVar4 * fVar20 + fVar5 * fVar26) *
                                    fVar46 * fVar46 * 0.5 +
                                    (fVar29 * fVar40 +
                                    fVar2 * fVar32 + fVar53 * fVar20 + fVar1 * fVar26) *
                                    (fVar36 * fVar36 + fVar16) * 0.5 +
                                    (fVar27 * fVar40 +
                                    fVar50 * fVar32 + fVar51 * fVar20 + fVar52 * fVar26) *
                                    (-fVar46 * fVar46 - fVar16) * 0.5 +
                                   (fVar25 * fVar40 +
                                   fVar45 * fVar32 + fVar47 * fVar20 + fVar49 * fVar26) *
                                   -fVar36 * fVar36 * 0.5) * fVar22) & uVar11);
        ddPdudv[3] = (float)(~uVar12 & (uint)ddPdudv[3] |
                            (uint)(((fVar43 * fVar41 +
                                    fVar3 * fVar33 + fVar4 * fVar21 + fVar5 * fVar28) *
                                    fVar48 * fVar48 * 0.5 +
                                    (fVar29 * fVar41 +
                                    fVar2 * fVar33 + fVar53 * fVar21 + fVar1 * fVar28) *
                                    (fVar37 * fVar37 + fVar17) * 0.5 +
                                    (fVar27 * fVar41 +
                                    fVar50 * fVar33 + fVar51 * fVar21 + fVar52 * fVar28) *
                                    (-fVar48 * fVar48 - fVar17) * 0.5 +
                                   (fVar25 * fVar41 +
                                   fVar45 * fVar33 + fVar47 * fVar21 + fVar49 * fVar28) *
                                   -fVar37 * fVar37 * 0.5) * fVar22) & uVar12);
        sVar13 = sVar13 + 1;
        ddPdudv = ddPdudv + dstride;
      } while (N != sVar13);
    }
  }
  return;
}

Assistant:

void eval(const vbool& valid, const vfloat& uu, const vfloat& vv, 
                float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, 
                const float dscale, const size_t dstride, const size_t N) const
      {
        if (P) {
          const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
          const Vec4<vfloat> v_n = BSplineBasis::eval(vv); 
          for (size_t i=0; i<N; i++) vfloat::store(valid,P+i*dstride,eval(i,uu,vv,u_n,v_n));
        }
        if (dPdu) 
        {
          {
            assert(dPdu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdu+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
          {
            assert(dPdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdv+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
        }
        if (ddPdudu) 
        {
          {
            assert(ddPdudu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative2(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudu+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdvdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative2(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdvdv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdudv);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
        }
      }